

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

void Js::CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
               (JavascriptString *s,Builder<256U> *toString,bool appendChars)

{
  char16 c;
  uint appendCharLength;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *pcVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ec,"(s)","s");
    if (!bVar2) goto LAB_00d2df00;
    *puVar3 = 0;
  }
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ed,"(toString)","toString");
    if (!bVar2) goto LAB_00d2df00;
    *puVar3 = 0;
  }
  if (toString->isFinalized == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ee,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00d2df00;
    *puVar3 = 0;
  }
  if ((appendChars) && (toString->directCharLength != 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3f0,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) goto LAB_00d2df00;
    *puVar3 = 0;
  }
  appendCharLength = s->m_charLength;
  if (appendCharLength == 0) {
    return;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,StringConcatPhase);
  if (bVar2) {
    pcVar6 = L"";
    pcVar4 = L"";
    if ((s->m_pszValue).ptr != (char16_t *)0x0) {
      pcVar4 = JavascriptString::GetString(s);
    }
    if ((s->m_pszValue).ptr == (char16_t *)0x0) {
      pcVar6 = L"...";
    }
    if (8 < appendCharLength) {
      pcVar6 = L"...";
    }
    pcVar5 = L"false";
    if (appendChars) {
      pcVar5 = L"true";
    }
    Output::Print(L"CompoundString::AppendGeneric(JavascriptString *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"
                  ,pcVar4,pcVar6,(ulong)appendCharLength,pcVar5);
    Output::Flush();
  }
  if ((appendChars) || (toString->directCharLength == 0xffffffff)) {
    if (appendCharLength == 1) {
      if (s == (JavascriptString *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                    ,0x1f6,"(s)","s");
        if (!bVar2) {
LAB_00d2df00:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      pcVar4 = JavascriptString::GetString(s);
      c = *pcVar4;
      bVar2 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(c,toString);
      if (!bVar2) {
        Builder<256U>::AppendSlow(toString,c);
        return;
      }
      return;
    }
    if ((appendChars) || (bVar2 = Block::ShouldAppendChars(appendCharLength,0), bVar2)) {
      if (s == (JavascriptString *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                    ,0x1f6,"(s)","s");
        if (!bVar2) goto LAB_00d2df00;
        *puVar3 = 0;
      }
      pcVar4 = JavascriptString::GetString(s);
      if (appendChars) {
        bVar2 = TryAppendGeneric<Js::CompoundString::Builder<256u>>
                          (pcVar4,appendCharLength,toString);
      }
      else {
        bVar2 = TryAppendFewCharsGeneric<Js::CompoundString::Builder<256u>>
                          (pcVar4,appendCharLength,toString);
      }
      if (bVar2 != false) {
        return;
      }
      Builder<256U>::AppendSlow(toString,pcVar4,appendCharLength);
      return;
    }
    Builder<256U>::SwitchToPointerMode(toString);
  }
  bVar2 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(s,appendCharLength,toString);
  if (bVar2) {
    return;
  }
  Builder<256U>::AppendSlow(toString,s);
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        JavascriptString *const s,
        String *const toString,
        const bool appendChars)
    {
        Assert(s);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        const CharCount appendCharLength = s->GetLength();
        if(appendCharLength == 0)
            return;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(JavascriptString *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"),
                s->IsFinalized() ? s->GetString() : _u(""),
                !s->IsFinalized() || appendCharLength > 8 ? _u("...") : _u(""),
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendCharLength == 1)
            {
                const char16 c = toString->GetAppendStringBuffer(s)[0];
                if(TryAppendGeneric(c, toString))
                    return;
                toString->AppendSlow(c);
                return;
            }

            if(appendChars || Block::ShouldAppendChars(appendCharLength))
            {
                const char16 *const appendBuffer = toString->GetAppendStringBuffer(s);
                if(appendChars
                        ? TryAppendGeneric(appendBuffer, appendCharLength, toString)
                        : TryAppendFewCharsGeneric(appendBuffer, appendCharLength, toString))
                {
                    return;
                }
                toString->AppendSlow(appendBuffer, appendCharLength);
                return;
            }

            toString->SwitchToPointerMode();
        }

        if(TryAppendGeneric(s, appendCharLength, toString))
            return;
        toString->AppendSlow(s);
    }